

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O3

arg_rex * arg_rex0(char *shortopts,char *longopts,char *pattern,char *datatype,int flags,
                  char *glossary)

{
  arg_rex *paVar1;
  
  paVar1 = arg_rexn(shortopts,longopts,pattern,datatype,0,1,flags,glossary);
  return paVar1;
}

Assistant:

struct arg_rex * arg_rex0(const char * shortopts,
						  const char * longopts,
						  const char * pattern,
						  const char * datatype,
						  int flags,
						  const char * glossary) {
	return arg_rexn(shortopts,
					longopts,
					pattern,
					datatype,
					0,
					1,
					flags,
					glossary);
}